

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_holder.hpp
# Opt level: O2

void __thiscall asio::detail::socket_holder::reset(socket_holder *this)

{
  int __fd;
  state_type state;
  error_code ec;
  
  __fd = this->socket_;
  if (__fd != -1) {
    std::_V2::system_category();
    socket_ops::close(__fd);
    this->socket_ = -1;
  }
  return;
}

Assistant:

void reset()
  {
    if (socket_ != invalid_socket)
    {
      asio::error_code ec;
      socket_ops::state_type state = 0;
      socket_ops::close(socket_, state, true, ec);
      socket_ = invalid_socket;
    }
  }